

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.c
# Opt level: O2

bool_t utilTest(void)

{
  bool_t bVar1;
  u32 uVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  
  pcVar3 = utilVersion();
  utilInfo();
  printf("utilVersion: %s [%s]\n",pcVar3,utilInfo::descr);
  sVar4 = utilMin(5,1,2,3,1,0);
  uVar6 = 0;
  if (sVar4 == 0) {
    uVar5 = 0;
    sVar4 = utilMax(5,1,2,3,1,0);
    uVar6 = 0;
    if (sVar4 == 3) {
      bVar1 = utilOnExit(destroy1);
      if (bVar1 != 0) {
        bVar1 = utilOnExit(destroy2);
        uVar6 = uVar5;
        if (bVar1 != 0) {
          bVar1 = utilOnExit(destroy2);
          if (bVar1 != 0) {
            bVar1 = utilOnExit(destroy2);
            if (bVar1 != 0) {
              uVar6 = 0;
              uVar2 = utilCRC32("123456789",9,0);
              if (uVar2 == 0xcbf43926) {
                uVar2 = utilFNV32("3pjNqM",6,0x811c9dc5);
                uVar6 = (uint)(uVar2 == 0);
              }
            }
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

bool_t utilTest()
{
	printf("utilVersion: %s [%s]\n", utilVersion(), utilInfo());
	if (utilMin(5, SIZE_1, (size_t)2, (size_t)3, SIZE_1, SIZE_0) != 0 ||
		utilMax(5, SIZE_1, (size_t)2, (size_t)3, SIZE_1, SIZE_0) != 3)
		return FALSE;
	// деструкторы
	if (!utilOnExit(destroy1) || !utilOnExit(destroy2) ||
		!utilOnExit(destroy2) || !utilOnExit(destroy2))
		return FALSE;
	// контрольные суммы
	if (utilCRC32("123456789", 9, 0) != 0xCBF43926)
		return FALSE;
	if (utilFNV32("3pjNqM", 6, 0x811C9DC5) != 0)
		return FALSE;
	// все нормально
	return TRUE;
}